

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

double __thiscall Tokenizer::readInteger(Tokenizer *this)

{
  char *__nptr;
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  bool bVar4;
  double dVar5;
  char c;
  string str;
  char local_61;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  local_50 = 0;
  local_48 = '\0';
  bVar4 = false;
  local_58 = &local_48;
  do {
    iVar1 = std::istream::peek();
    if ((iVar1 != 0x2e) || (bVar4)) {
      iVar1 = std::istream::peek();
      __nptr = local_58;
      if (9 < iVar1 - 0x30U) break;
    }
    std::istream::get((char *)this->inStream);
    if (local_61 == '.') {
      bVar4 = true;
    }
    std::__cxx11::string::push_back((char)&local_58);
  } while( true );
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  dVar5 = strtod(__nptr,&local_38);
  if (local_38 == __nptr) {
    uVar3 = std::__throw_invalid_argument("stod");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
    }
    _Unwind_Resume(uVar3);
  }
  if (*piVar2 != 0) {
    if (*piVar2 != 0x22) goto LAB_00112953;
    dVar5 = (double)std::__throw_out_of_range("stod");
  }
  *piVar2 = iVar1;
LAB_00112953:
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return dVar5;
}

Assistant:

double Tokenizer::readInteger() {
    // This function is called when it is known that
    // the first character in input is a digit.
    // The function reads and returns all remaining digits.

    double doubleStr = 0;
    std::string str;
    char c;
    bool decimal = false;
    while( ((inStream.peek() == '.') && !decimal) || isdigit(inStream.peek())) {
        inStream.get(c);
        if(c == '.')
            decimal = true;
        str += c;
    }
    doubleStr = std::stod(str);
    return doubleStr;
}